

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O2

void writePic<PicHeaderPS3>(ostream *stream,PicHeader *header,istream *reference)

{
  pointer pPVar1;
  PicChunk *chunk;
  pointer pPVar2;
  PicChunkPS3 local_40;
  PicHeaderPS3 local_38;
  
  std::istream::seekg((long)reference,_S_beg);
  readRaw<PicHeaderPS3>(&local_38,reference);
  local_38.filesize.value_ = (uchar  [4])header->filesize;
  local_38.ew.value_ = (uchar  [2])header->ew;
  local_38.eh.value_ = (uchar  [2])header->eh;
  local_38.width.value_ = (uchar  [2])header->width;
  local_38.height.value_ = (uchar  [2])header->height;
  local_38.chunks.value_ =
       SUB84(((long)(header->chunks).super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl
                    .super__Vector_impl_data._M_finish -
             (long)(header->chunks).super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0xc,0);
  writeRaw<PicHeaderPS3>(stream,&local_38);
  copyBytes(stream,reference,0);
  pPVar1 = (header->chunks).super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pPVar2 = (header->chunks).super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
                super__Vector_impl_data._M_start; pPVar2 != pPVar1; pPVar2 = pPVar2 + 1) {
    local_40.x.value_ = (uchar  [2])pPVar2->x;
    local_40.y.value_ = (uchar  [2])pPVar2->y;
    local_40.offset.value_ = (uchar  [4])pPVar2->offset;
    writeRaw<PicChunkPS3>(stream,&local_40);
  }
  return;
}

Assistant:

void writePic(std::ostream& stream, const PicHeader& header, std::istream& reference) {
	reference.seekg(0, reference.beg);
	Header h = readRaw<Header>(reference);
	h.filesize = header.filesize;
	h.ew = header.ew;
	h.eh = header.eh;
	h.width = header.width;
	h.height = header.height;
	h.chunks = header.chunks.size();
	writeRaw(stream, h);
	copyBytes(stream, reference, h.bytesToSkip());
	for (const auto& chunk : header.chunks) {
		typename Header::Chunk c(chunk.x, chunk.y, chunk.offset, chunk.size);
		writeRaw(stream, c);
	}
}